

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transpose.h
# Opt level: O2

void Eigen::internal::
     inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
               (Matrix<double,__1,__1,_0,__1,__1> *m)

{
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_30;
  Matrix<double,__1,__1,_0,__1,__1> *local_28 [3];
  
  local_30.m_matrix = m;
  if ((m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
      (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
    local_28[0] = m;
    TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>,10u,Eigen::Dense>::
    swap<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u,Eigen::Dense> *)local_28,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_30
              );
  }
  else {
    Matrix<double,-1,-1,1,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,1,_1,_1> *)local_28,&local_30);
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (m,(Matrix<double,__1,__1,_1,__1,__1> *)local_28);
    free(local_28[0]);
  }
  return;
}

Assistant:

static void run(MatrixType& m) {
    if (m.rows()==m.cols())
      m.matrix().template triangularView<StrictlyUpper>().swap(m.matrix().transpose());
    else
      m = m.transpose().eval();
  }